

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineCam::Set_flat_oscillate(ChLineCam *this,double me,double md,double mb0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 extraout_var [56];
  
  this->e = me;
  this->d = md;
  this->b0 = mb0;
  auVar2._0_8_ = sin(mb0);
  auVar2._8_56_ = extraout_var;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = md;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = me;
  auVar1 = vfmadd213sd_fma(auVar2._0_16_,auVar3,auVar1);
  this->Rb = auVar1._0_8_;
  return;
}

Assistant:

void ChLineCam::Set_flat_oscillate(double me, double md, double mb0) {
    e = me;
    d = md;
    b0 = mb0;
    Rb = e + d * sin(b0);
}